

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

ostream * helics::operator<<(ostream *out,ActionMessage *command)

{
  ActionMessage *in_RDX;
  string local_30;
  
  prettyPrintString_abi_cxx11_(&local_30,(helics *)command,in_RDX);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ActionMessage& command)
{
    out << prettyPrintString(command);
    return out;
}